

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintWithFallback<ot::commissioner::coap::Code>(Code *value,ostream *os)

{
  ostream *os_local;
  Code *value_local;
  
  FallbackPrinter::PrintValue<ot::commissioner::coap::Code>(value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}